

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O1

string * __thiscall
cmCustomCommandGenerator::GetCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this,uint c)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  cmCustomCommandLines *pcVar4;
  cmGeneratorTarget *this_01;
  char *pcVar5;
  allocator local_79;
  undefined1 local_78 [8];
  string local_70;
  undefined1 local_50 [32];
  
  pcVar4 = cmCustomCommand::GetCommandLines(this->CC);
  this_01 = cmLocalGenerator::FindGeneratorTargetToUse
                      (this->LG,*(string **)
                                 &(pcVar4->
                                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  ).
                                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                  ._M_impl.super__Vector_impl_data._M_start[c].
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      );
  if (this_01 != (cmGeneratorTarget *)0x0) {
    TVar3 = cmGeneratorTarget::GetType(this_01);
    if (TVar3 == EXECUTABLE) {
      bVar1 = cmGeneratorTarget::IsImported(this_01);
      if (bVar1) {
        bVar2 = true;
        bVar1 = false;
      }
      else {
        this_00 = this->LG->Makefile;
        local_70._M_dataplus._M_p = local_78 + 0x18;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_78 + 8),"CMAKE_CROSSCOMPILING","");
        bVar2 = cmMakefile::IsOn(this_00,(string *)(local_78 + 8));
        bVar2 = !bVar2;
        bVar1 = true;
      }
      goto LAB_00341db9;
    }
  }
  bVar1 = false;
  bVar2 = false;
LAB_00341db9:
  if ((bVar1) && (local_70._M_dataplus._M_p != local_78 + 0x18)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    pcVar5 = cmGeneratorTarget::GetLocation(this_01,&this->Config);
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,(allocator *)local_50);
  }
  else {
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_78,(string *)this->GE);
    local_50._8_8_ = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
    local_50[0x10] = '\0';
    local_50._0_8_ = (cmState *)(local_50 + 0x10);
    pcVar5 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_78,this->LG,&this->Config,false,
                        (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,(string *)local_50);
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_79);
    if ((cmState *)local_50._0_8_ != (cmState *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,CONCAT71(local_50._17_7_,local_50[0x10]) + 1);
    }
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetCommand(unsigned int c) const
{
  std::string const& argv0 = this->CC.GetCommandLines()[c][0];
  cmGeneratorTarget* target =
      this->LG->FindGeneratorTargetToUse(argv0);
  if(target && target->GetType() == cmState::EXECUTABLE &&
     (target->IsImported()
      || !this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")))
    {
    return target->GetLocation(this->Config);
    }
  return this->GE->Parse(argv0)->Evaluate(this->LG, this->Config);
}